

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.hpp
# Opt level: O3

Matrix<int> __thiscall Matrix<int>::operator=(Matrix<int> *this,Matrix<int> *R)

{
  long lVar1;
  int **ppiVar2;
  long lVar3;
  int *piVar4;
  int *in_RDX;
  int **extraout_RDX;
  long lVar5;
  ulong uVar6;
  int iVar7;
  long lVar8;
  Matrix<int> MVar9;
  
  iVar7 = *in_RDX;
  R->n = iVar7;
  uVar6 = (ulong)(uint)in_RDX[1];
  R->m = in_RDX[1];
  if (0 < iVar7) {
    lVar1 = *(long *)(in_RDX + 2);
    ppiVar2 = R->M;
    lVar5 = 0;
    do {
      if (0 < (int)uVar6) {
        lVar3 = *(long *)(lVar1 + lVar5 * 8);
        piVar4 = ppiVar2[lVar5];
        lVar8 = 0;
        do {
          piVar4[lVar8] = *(int *)(lVar3 + lVar8 * 4);
          lVar8 = lVar8 + 1;
          uVar6 = (ulong)in_RDX[1];
        } while (lVar8 < (long)uVar6);
        iVar7 = *in_RDX;
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < iVar7);
  }
  Matrix(this,R);
  MVar9.M = extraout_RDX;
  MVar9._0_8_ = this;
  return MVar9;
}

Assistant:

Matrix operator=(const Matrix& R) {
    n = R.n;
    m = R.m;
    for (int i = 0; i < R.n; i++) {
      for (int j = 0; j < R.m; j++) {
        M[i][j] = R.M[i][j];
      }
    }
    return *this;
  }